

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatHelpers.cpp
# Opt level: O0

bool __thiscall
slang::ast::checkArgType<slang::ast::ASTContext_const>
          (ast *this,ASTContext *context,Expression *arg,char spec,SourceRange range)

{
  char arg_00;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  int iVar2;
  bitwidth_t bVar3;
  Type *this_00;
  Diagnostic *pDVar4;
  undefined7 in_register_00000009;
  SourceLocation SVar5;
  SourceLocation SVar6;
  Type *type;
  char spec_local;
  Expression *arg_local;
  ASTContext *context_local;
  SourceRange range_local;
  
  SVar5._1_7_ = in_register_00000009;
  SVar5._0_1_ = spec;
  SVar6 = range.startLoc;
  arg_00 = (char)arg;
  bVar1 = Expression::bad((Expression *)context);
  if (!bVar1) {
    this_00 = not_null<const_slang::ast::Type_*>::operator*
                        ((not_null<const_slang::ast::Type_*> *)&context->lookupIndex);
    iVar2 = tolower((int)arg_00);
    switch(iVar2) {
    case 0x62:
    case 99:
    case 100:
    case 0x68:
    case 0x6f:
    case 0x78:
      bVar1 = Type::isIntegral(this_00);
      if ((bVar1) || (bVar1 = Type::isString(this_00), bVar1)) {
        return true;
      }
      bVar1 = Type::isFloating(this_00);
      if (bVar1) {
        sourceRange.startLoc = (SourceLocation)context->firstTempVar;
        sourceRange.endLoc = (SourceLocation)context->randomizeDetails;
        pDVar4 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x29000b,sourceRange);
        pDVar4 = Diagnostic::operator<<(pDVar4,arg_00);
        range_02.endLoc = SVar6;
        range_02.startLoc = SVar5;
        Diagnostic::operator<<(pDVar4,range_02);
        return true;
      }
      break;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x74:
      bVar1 = Type::isNumeric(this_00);
      if (bVar1) {
        return true;
      }
      break;
    default:
      break;
    case 0x70:
      return true;
    case 0x73:
      bVar1 = Type::canBeStringLike(this_00);
      if (bVar1) {
        return true;
      }
      break;
    case 0x75:
    case 0x7a:
      bVar1 = isValidForRaw(this_00);
      if (bVar1) {
        return true;
      }
      break;
    case 0x76:
      bVar1 = Type::isIntegral(this_00);
      if (bVar1) {
        bVar3 = Type::getBitWidth(this_00);
        if (1 < bVar3) {
          sourceRange_00.startLoc = (SourceLocation)context->firstTempVar;
          sourceRange_00.endLoc = (SourceLocation)context->randomizeDetails;
          pDVar4 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x28000b,sourceRange_00);
          range_01.endLoc = SVar6;
          range_01.startLoc = SVar5;
          Diagnostic::operator<<(pDVar4,range_01);
        }
        return true;
      }
    }
    sourceRange_01.startLoc = (SourceLocation)context->firstTempVar;
    sourceRange_01.endLoc = (SourceLocation)context->randomizeDetails;
    pDVar4 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x10000b,sourceRange_01);
    pDVar4 = operator<<(pDVar4,this_00);
    pDVar4 = Diagnostic::operator<<(pDVar4,arg_00);
    range_00.endLoc = SVar6;
    range_00.startLoc = SVar5;
    Diagnostic::operator<<(pDVar4,range_00);
  }
  return false;
}

Assistant:

static bool checkArgType(TContext& context, const Expression& arg, char spec, SourceRange range) {
    if (arg.bad())
        return false;

    auto& type = *arg.type;
    switch (::tolower(spec)) {
        case 'h':
        case 'x':
        case 'd':
        case 'o':
        case 'b':
        case 'c':
            if (type.isIntegral() || type.isString())
                return true;
            if (type.isFloating()) {
                // Just a warning, we will implicitly convert.
                context.addDiag(diag::FormatRealInt, arg.sourceRange) << spec << range;
                return true;
            }
            break;
        case 'e':
        case 'f':
        case 'g':
        case 't':
            if (type.isNumeric())
                return true;
            break;
        case 'v':
            if (type.isIntegral()) {
                if (type.getBitWidth() > 1)
                    context.addDiag(diag::FormatMultibitStrength, arg.sourceRange) << range;
                return true;
            }
            break;
        case 'u':
        case 'z':
            if (isValidForRaw(type))
                return true;
            break;
        case 'p':
            // Always valid.
            return true;
        case 's':
            if (type.canBeStringLike())
                return true;
            break;
        default:
            break;
    }

    context.addDiag(diag::FormatMismatchedType, arg.sourceRange) << type << spec << range;
    return false;
}